

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<float>::resize(ImVector<float> *this,int new_size,float *v)

{
  int new_capacity;
  int local_24;
  int n;
  float *v_local;
  int new_size_local;
  ImVector<float> *this_local;
  
  if (this->Capacity < new_size) {
    new_capacity = _grow_capacity(this,new_size);
    reserve(this,new_capacity);
  }
  if (this->Size < new_size) {
    for (local_24 = this->Size; local_24 < new_size; local_24 = local_24 + 1) {
      this->Data[local_24] = *v;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }